

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lev_main.c
# Opt level: O0

lc_funcdefs * funcdef_defined(lc_funcdefs *f,char *name,int casesense)

{
  int iVar1;
  int casesense_local;
  char *name_local;
  lc_funcdefs *f_local;
  
  name_local = (char *)f;
  do {
    if (name_local == (char *)0x0) {
      return (lc_funcdefs *)0x0;
    }
    if (casesense == 0) {
      iVar1 = strcasecmp(name,*(char **)(name_local + 8));
      if (iVar1 == 0) {
        return (lc_funcdefs *)name_local;
      }
    }
    else {
      iVar1 = strcmp(name,*(char **)(name_local + 8));
      if (iVar1 == 0) {
        return (lc_funcdefs *)name_local;
      }
    }
    name_local = *(char **)name_local;
  } while( true );
}

Assistant:

struct lc_funcdefs *funcdef_defined(struct lc_funcdefs *f, const char *name,
				    int casesense)
{
	while (f) {
	    if (casesense) {
		if (!strcmp(name, f->name)) return f;
	    } else {
		if (!strcasecmp(name, f->name)) return f;
	    }
	    f = f->next;
	}
	return NULL;
}